

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void exe_save_again_obj(vocoldef *againv,vocoldef *objv,char **bufp)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  long *in_RDX;
  void *in_RSI;
  undefined2 *in_RDI;
  size_t copylen;
  
  if (in_RSI == (void *)0x0) {
    *in_RDI = 0xffff;
  }
  else {
    memcpy(in_RDI,in_RSI,0x28);
    if ((*(long *)((long)in_RSI + 8) != 0) && (*(long *)((long)in_RSI + 0x10) != 0)) {
      lVar1 = *(long *)((long)in_RSI + 0x10);
      lVar2 = *(long *)((long)in_RSI + 8);
      sVar3 = strlen(*(char **)((long)in_RSI + 0x10));
      sVar3 = (lVar1 - lVar2) + sVar3 + 1;
      memcpy((void *)*in_RDX,*(void **)((long)in_RSI + 8),sVar3);
      *(long *)(in_RDI + 4) = *in_RDX;
      *(long *)(in_RDI + 8) =
           *in_RDX + (*(long *)((long)in_RSI + 0x10) - *(long *)((long)in_RSI + 8));
      *in_RDX = sVar3 + *in_RDX;
    }
  }
  return;
}

Assistant:

static void exe_save_again_obj(vocoldef *againv, const vocoldef *objv,
                               char **bufp)
{
    /* if there's an object, save it */
    if (objv != 0)
    {
        /* copy the object information structure */
        memcpy(againv, objv, sizeof(*againv));

        /* copy the original command words to the "again" buffer */
        if (objv->vocolfst != 0 && objv->vocollst != 0)
        {
            size_t copylen;
            
            /* 
             *   Compute the length of the entire list.  The words are
             *   arranged consecutively in the buffer, separated by null
             *   bytes, so we must copy everything from the first word to
             *   the start of the last word, plus the length of the last
             *   word, plus the last word's trailing null byte.  
             */
            copylen = objv->vocollst - objv->vocolfst
                      + strlen(objv->vocollst) + 1;

            /* copy the text */
            memcpy(*bufp, objv->vocolfst, copylen);

            /* 
             *   set the new structure to point into the copy, not the
             *   original 
             */
            againv->vocolfst = *bufp;
            againv->vocollst = *bufp + (objv->vocollst - objv->vocolfst);

            /* skip past the space we've consumed in the buffer */
            *bufp += copylen;
        }
    }
    else
    {
        /* there's nothing to save - just set the object ID to invalid */
        againv->vocolobj = MCMONINV;
    }
}